

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O3

XrResult RuntimeInterface::TryLoadingSingleRuntime
                   (string *openxr_command,
                   unique_ptr<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                   *manifest_file)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ManifestFile *this;
  pointer pcVar2;
  RuntimeInterface *pRVar3;
  bool bVar4;
  pointer pXVar5;
  ulong uVar6;
  uint uVar7;
  char cVar8;
  char cVar9;
  XrResult XVar10;
  LoaderPlatformLibraryHandle pvVar11;
  string *psVar12;
  code *pcVar13;
  char *pcVar14;
  unique_ptr<RuntimeInterface,_std::default_delete<RuntimeInterface>_> *puVar15;
  RuntimeInterface *pRVar16;
  uint uVar17;
  pointer __src;
  uint uVar18;
  uint uVar19;
  string info_message;
  string library_message;
  string warning_message;
  string function_name;
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> extension_properties;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  supported_extensions;
  undefined1 local_198 [32];
  string local_178 [4];
  string local_e0;
  undefined8 local_c0;
  long *local_b8;
  long local_b0;
  long local_a8 [2];
  vector<XrExtensionProperties,_std::allocator<XrExtensionProperties>_> local_98;
  vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> local_78;
  undefined8 uStack_60;
  PFN_xrGetInstanceProcAddr local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  pvVar11 = (LoaderPlatformLibraryHandle)
            dlopen((((manifest_file->_M_t).
                     super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                     .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
                   super_ManifestFile)._library_path._M_dataplus._M_p,1);
  if (pvVar11 == (LoaderPlatformLibraryHandle)0x0) {
    pcVar14 = (char *)dlerror();
    std::__cxx11::string::string((string *)local_178,pcVar14,(allocator *)&local_e0);
    local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_e0,"RuntimeInterface::LoadRuntime skipping manifest file ","");
    std::__cxx11::string::_M_append
              ((char *)&local_e0,
               *(ulong *)&(((manifest_file->_M_t).
                            super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                            .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
                          super_ManifestFile)._filename);
    std::__cxx11::string::append((char *)&local_e0);
    std::__cxx11::string::_M_append((char *)&local_e0,(ulong)local_178[0]._M_dataplus._M_p);
    std::__cxx11::string::append((char *)&local_e0);
    local_78.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    LoaderLogger::LogErrorMessage(openxr_command,&local_e0,&local_78);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector(&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
      operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178[0]._M_dataplus._M_p != &local_178[0].field_2) {
      operator_delete(local_178[0]._M_dataplus._M_p,local_178[0].field_2._M_allocated_capacity + 1);
    }
    return XR_ERROR_FILE_ACCESS_ERROR;
  }
  this = &((manifest_file->_M_t).
           super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>.
           _M_t.
           super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>.
           super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->super_ManifestFile;
  paVar1 = &local_178[0].field_2;
  local_178[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"xrNegotiateLoaderRuntimeInterface","");
  psVar12 = ManifestFile::GetFunctionName(this,local_178);
  local_b8 = local_a8;
  pcVar2 = (psVar12->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_b8,pcVar2,pcVar2 + psVar12->_M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178[0]._M_dataplus._M_p != paVar1) {
    operator_delete(local_178[0]._M_dataplus._M_p,local_178[0].field_2._M_allocated_capacity + 1);
  }
  if (local_b0 == 0) {
    __assert_fail("!name.empty()",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]OpenXR-SDK/src/loader/loader_platform.hpp"
                  ,0x40,
                  "void *LoaderPlatformLibraryGetProcAddr(LoaderPlatformLibraryHandle, const std::string &)"
                 );
  }
  pcVar13 = (code *)dlsym(pvVar11,local_b8);
  local_e0._M_dataplus._M_p = (pointer)0x100000001;
  local_e0._M_string_length = 0x28;
  local_e0.field_2._M_allocated_capacity = 0x100000001;
  local_e0.field_2._8_8_ = 0x1000000000000;
  local_c0 = 0x103ff00000fff;
  local_78.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uStack_60 = 0;
  local_58 = (PFN_xrGetInstanceProcAddr)0x0;
  local_78.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x100000003;
  local_78.super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x28;
  if (pcVar13 == (code *)0x0) {
    local_178[0]._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_178,
               "RuntimeInterface::LoadRuntime failed to find negotiate function ","");
    std::__cxx11::string::_M_append((char *)local_178,(ulong)local_b8);
    local_198._0_8_ = (pointer)0x0;
    local_198._8_8_ = (pointer)0x0;
    local_198._16_8_ = (pointer)0x0;
    LoaderLogger::LogErrorMessage
              (openxr_command,local_178,
               (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
    std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
              ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178[0]._M_dataplus._M_p != paVar1) {
      operator_delete(local_178[0]._M_dataplus._M_p,local_178[0].field_2._M_allocated_capacity + 1);
    }
    XVar10 = XR_ERROR_RUNTIME_FAILURE;
  }
  else {
    XVar10 = (*pcVar13)(&local_e0,&local_78);
    if (XR_ERROR_VALIDATION_FAILURE < XVar10) {
      if (local_58 == (PFN_xrGetInstanceProcAddr)0x0) {
        local_178[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"RuntimeInterface::LoadRuntime skipping manifest file ","");
        std::__cxx11::string::_M_append
                  ((char *)local_178,
                   *(ulong *)&(((manifest_file->_M_t).
                                super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                                .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
                              super_ManifestFile)._filename);
        std::__cxx11::string::append((char *)local_178);
        local_198._0_8_ = (pointer)0x0;
        local_198._8_8_ = (pointer)0x0;
        local_198._16_8_ = (pointer)0x0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,local_178,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
      }
      else if ((uint)local_78.
                     super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage == 1) {
        if ((uStack_60 & 0xffff000000000000) == 0x1000000000000) {
          local_198._0_8_ = (pointer)(local_198 + 0x10);
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_198,
                     "RuntimeInterface::LoadRuntime succeeded loading runtime defined in manifest file "
                     ,"");
          std::__cxx11::string::_M_append
                    (local_198,
                     *(ulong *)&(((manifest_file->_M_t).
                                  super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                                  .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)
                                ->super_ManifestFile)._filename);
          std::__cxx11::string::append(local_198);
          uVar19 = (uint)local_78.
                         super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage;
          cVar9 = '\x01';
          if (9 < (uint)local_78.
                        super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            uVar18 = (uint)local_78.
                           super__Vector_base<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage;
            cVar8 = '\x04';
            do {
              cVar9 = cVar8;
              if (uVar18 < 100) {
                cVar9 = cVar9 + -2;
                goto LAB_0011a76a;
              }
              if (uVar18 < 1000) {
                cVar9 = cVar9 + -1;
                goto LAB_0011a76a;
              }
              if (uVar18 < 10000) goto LAB_0011a76a;
              bVar4 = 99999 < uVar18;
              uVar18 = uVar18 / 10000;
              cVar8 = cVar9 + '\x04';
            } while (bVar4);
            cVar9 = cVar9 + '\x01';
          }
LAB_0011a76a:
          local_178[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)local_178,cVar9);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_178[0]._M_dataplus._M_p,(uint)local_178[0]._M_string_length,uVar19);
          std::__cxx11::string::_M_append(local_198,(ulong)local_178[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_178[0]._M_dataplus._M_p,
                            local_178[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(local_198);
          uVar6 = uStack_60;
          uVar18 = 1;
          uVar19 = (uint)(uStack_60 >> 0x20);
          if (((4 < uVar19 >> 0x11) && (uVar18 = 2, 0x18 < uVar19 >> 0x12)) &&
             (uVar18 = 3, 0x7c < uVar19 >> 0x13)) {
            uVar18 = 5 - (uVar19 >> 0x14 < 0x271);
          }
          local_178[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)local_178,(char)uVar18);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_178[0]._M_dataplus._M_p,uVar18,(uint)(ushort)(uVar6 >> 0x30));
          std::__cxx11::string::_M_append(local_198,(ulong)local_178[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_178[0]._M_dataplus._M_p,
                            local_178[0].field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::append(local_198);
          uVar19 = (uint)uStack_60._4_2_;
          uVar18 = 1;
          if (((9 < uStack_60._4_2_) && (uVar18 = 2, 99 < uStack_60._4_2_)) &&
             (uVar18 = 3, 999 < uVar19)) {
            uVar18 = 5 - (uVar19 < 10000);
          }
          local_178[0]._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct((ulong)local_178,(char)uVar18);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_178[0]._M_dataplus._M_p,uVar18,uVar19);
          std::__cxx11::string::_M_append(local_198,(ulong)local_178[0]._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_178[0]._M_dataplus._M_p != paVar1) {
            operator_delete(local_178[0]._M_dataplus._M_p,
                            local_178[0].field_2._M_allocated_capacity + 1);
          }
          local_178[0]._M_dataplus._M_p = (pointer)0x0;
          local_178[0]._M_string_length = 0;
          local_178[0].field_2._M_allocated_capacity = 0;
          LoaderLogger::LogInfoMessage
                    (openxr_command,(string *)local_198,
                     (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_178);
          std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                    ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_178);
          puVar15 = GetInstance();
          pRVar16 = (RuntimeInterface *)operator_new(0xf0);
          pRVar16->_vptr_RuntimeInterface = (_func_int **)&PTR__RuntimeInterface_00150ae8;
          pRVar16->_runtime_library = pvVar11;
          pRVar16->_get_instance_proc_addr = local_58;
          (pRVar16->_dispatch_table_map)._M_h._M_buckets =
               &(pRVar16->_dispatch_table_map)._M_h._M_single_bucket;
          (pRVar16->_dispatch_table_map)._M_h._M_bucket_count = 1;
          (pRVar16->_dispatch_table_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          (pRVar16->_dispatch_table_map)._M_h._M_element_count = 0;
          (pRVar16->_dispatch_table_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (pRVar16->_dispatch_table_map)._M_h._M_rehash_policy._M_next_resize = 0;
          (pRVar16->_dispatch_table_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          *(undefined8 *)&(pRVar16->_dispatch_table_mutex).super___mutex_base._M_mutex = 0;
          *(undefined8 *)((long)&(pRVar16->_dispatch_table_mutex).super___mutex_base._M_mutex + 8) =
               0;
          *(undefined8 *)
           ((long)&(pRVar16->_dispatch_table_mutex).super___mutex_base._M_mutex + 0x10) = 0;
          (pRVar16->_dispatch_table_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
               (__pthread_internal_list *)0x0;
          (pRVar16->_dispatch_table_mutex).super___mutex_base._M_mutex.__data.__list.__next =
               (__pthread_internal_list *)0x0;
          (pRVar16->_messenger_to_instance_map)._M_h._M_buckets =
               &(pRVar16->_messenger_to_instance_map)._M_h._M_single_bucket;
          (pRVar16->_messenger_to_instance_map)._M_h._M_bucket_count = 1;
          (pRVar16->_messenger_to_instance_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0
          ;
          (pRVar16->_messenger_to_instance_map)._M_h._M_element_count = 0;
          (pRVar16->_messenger_to_instance_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          (pRVar16->_messenger_to_instance_map)._M_h._M_rehash_policy._M_next_resize = 0;
          (pRVar16->_messenger_to_instance_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
          *(undefined8 *)&(pRVar16->_messenger_to_instance_mutex).super___mutex_base._M_mutex = 0;
          *(undefined8 *)
           ((long)&(pRVar16->_messenger_to_instance_mutex).super___mutex_base._M_mutex + 8) = 0;
          *(undefined8 *)
           ((long)&(pRVar16->_messenger_to_instance_mutex).super___mutex_base._M_mutex + 0x10) = 0;
          (pRVar16->_messenger_to_instance_mutex).super___mutex_base._M_mutex.__data.__list.__prev =
               (__pthread_internal_list *)0x0;
          (pRVar16->_messenger_to_instance_mutex).super___mutex_base._M_mutex.__data.__list.__next =
               (__pthread_internal_list *)0x0;
          *(undefined8 *)
           &(pRVar16->_supported_extensions).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl = 0;
          (pRVar16->_supported_extensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (pRVar16->_supported_extensions).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          pRVar3 = (puVar15->_M_t).
                   super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                   .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl;
          (puVar15->_M_t).
          super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>._M_t.
          super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>.
          super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl = pRVar16;
          if (pRVar3 != (RuntimeInterface *)0x0) {
            (*pRVar3->_vptr_RuntimeInterface[1])();
          }
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_48.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_98.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_98.super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          puVar15 = GetInstance();
          GetInstanceExtensionProperties
                    ((puVar15->_M_t).
                     super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                     .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl,&local_98);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::reserve(&local_48,
                    ((long)local_98.
                           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)local_98.
                           super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x79435e50d79435e5);
          pXVar5 = local_98.
                   super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_98.
              super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_start !=
              local_98.
              super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            __src = local_98.
                    super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            do {
              memcpy(local_178,__src,0x98);
              std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              emplace_back<char(&)[128]>
                        ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                         &local_48,(char (*) [128])&local_178[0].field_2);
              __src = __src + 1;
            } while (__src != pXVar5);
          }
          puVar15 = GetInstance();
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator=(&((puVar15->_M_t).
                        super___uniq_ptr_impl<RuntimeInterface,_std::default_delete<RuntimeInterface>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_RuntimeInterface_*,_std::default_delete<RuntimeInterface>_>
                        .super__Head_base<0UL,_RuntimeInterface_*,_false>._M_head_impl)->
                       _supported_extensions,&local_48);
          if (local_98.
              super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_98.
                            super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (long)local_98.
                                  super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_98.
                                  super__Vector_base<XrExtensionProperties,_std::allocator<XrExtensionProperties>_>
                                  ._M_impl.super__Vector_impl_data._M_start);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&local_48);
          if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
            operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
          }
          XVar10 = XR_SUCCESS;
          goto LAB_0011a732;
        }
        local_178[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"RuntimeInterface::LoadRuntime skipping manifest file ","");
        std::__cxx11::string::_M_append
                  ((char *)local_178,
                   *(ulong *)&(((manifest_file->_M_t).
                                super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                                .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
                              super_ManifestFile)._filename);
        std::__cxx11::string::append((char *)local_178);
        local_198._0_8_ = (pointer)0x0;
        local_198._8_8_ = (pointer)0x0;
        local_198._16_8_ = (pointer)0x0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,local_178,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
      }
      else {
        local_178[0]._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_178,"RuntimeInterface::LoadRuntime skipping manifest file ","");
        std::__cxx11::string::_M_append
                  ((char *)local_178,
                   *(ulong *)&(((manifest_file->_M_t).
                                super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                                .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
                              super_ManifestFile)._filename);
        std::__cxx11::string::append((char *)local_178);
        local_198._0_8_ = (pointer)0x0;
        local_198._8_8_ = (pointer)0x0;
        local_198._16_8_ = (pointer)0x0;
        LoaderLogger::LogErrorMessage
                  (openxr_command,local_178,
                   (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
      }
      std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
                ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_178[0]._M_dataplus._M_p != paVar1) {
        operator_delete(local_178[0]._M_dataplus._M_p,local_178[0].field_2._M_allocated_capacity + 1
                       );
      }
      XVar10 = XR_ERROR_FILE_CONTENTS_INVALID;
    }
  }
  local_178[0]._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_178,"RuntimeInterface::LoadRuntime skipping manifest file ","");
  std::__cxx11::string::_M_append
            ((char *)local_178,
             *(ulong *)&(((manifest_file->_M_t).
                          super___uniq_ptr_impl<RuntimeManifestFile,_std::default_delete<RuntimeManifestFile>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_RuntimeManifestFile_*,_std::default_delete<RuntimeManifestFile>_>
                          .super__Head_base<0UL,_RuntimeManifestFile_*,_false>._M_head_impl)->
                        super_ManifestFile)._filename);
  std::__cxx11::string::append((char *)local_178);
  uVar18 = -XVar10;
  uVar19 = 1;
  if (9 < uVar18) {
    uVar17 = uVar18;
    uVar7 = 4;
    do {
      uVar19 = uVar7;
      if (uVar17 < 100) {
        uVar19 = uVar19 - 2;
        goto LAB_0011a68a;
      }
      if (uVar17 < 1000) {
        uVar19 = uVar19 - 1;
        goto LAB_0011a68a;
      }
      if (uVar17 < 10000) goto LAB_0011a68a;
      bVar4 = 99999 < uVar17;
      uVar17 = uVar17 / 10000;
      uVar7 = uVar19 + 4;
    } while (bVar4);
    uVar19 = uVar19 + 1;
  }
LAB_0011a68a:
  local_198._0_8_ = (pointer)(local_198 + 0x10);
  std::__cxx11::string::_M_construct((ulong)local_198,(char)uVar19 + '\x01');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)(local_198._0_8_ + 1),uVar19,uVar18);
  std::__cxx11::string::_M_append((char *)local_178,local_198._0_8_);
  if ((pointer)local_198._0_8_ != (pointer)(local_198 + 0x10)) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_198._16_8_ + 1));
  }
  local_198._0_8_ = (pointer)0x0;
  local_198._8_8_ = (pointer)0x0;
  local_198._16_8_ = (pointer)0x0;
  LoaderLogger::LogErrorMessage
            (openxr_command,local_178,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)local_198);
  dlclose(pvVar11);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178[0]._M_dataplus._M_p != &local_178[0].field_2) {
    operator_delete(local_178[0]._M_dataplus._M_p,local_178[0].field_2._M_allocated_capacity + 1);
  }
LAB_0011a732:
  if (local_b8 != local_a8) {
    operator_delete(local_b8,local_a8[0] + 1);
  }
  return XVar10;
}

Assistant:

XrResult RuntimeInterface::TryLoadingSingleRuntime(const std::string& openxr_command,
                                                   std::unique_ptr<RuntimeManifestFile>& manifest_file) {
    LoaderPlatformLibraryHandle runtime_library = LoaderPlatformLibraryOpen(manifest_file->LibraryPath());
    if (nullptr == runtime_library) {
        std::string library_message = LoaderPlatformLibraryOpenError(manifest_file->LibraryPath());
        std::string warning_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
        warning_message += manifest_file->Filename();
        warning_message += ", failed to load with message \"";
        warning_message += library_message;
        warning_message += "\"";
        LoaderLogger::LogErrorMessage(openxr_command, warning_message);
        return XR_ERROR_FILE_ACCESS_ERROR;
    }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
    if (!LoaderInitData::instance().initialized()) {
        LoaderLogger::LogErrorMessage(openxr_command, "RuntimeInterface::LoadRuntime skipping manifest file " +
                                                          manifest_file->Filename() +
                                                          " because xrInitializeLoaderKHR was not yet called.");

        LoaderPlatformLibraryClose(runtime_library);
        return XR_ERROR_VALIDATION_FAILURE;
    }
    bool forwardedInitLoader = false;
    {
        // If we have xrInitializeLoaderKHR exposed as an export, forward call to it.
        const auto function_name = manifest_file->GetFunctionName("xrInitializeLoaderKHR");
        auto initLoader =
            reinterpret_cast<PFN_xrInitializeLoaderKHR>(LoaderPlatformLibraryGetProcAddr(runtime_library, function_name));
        if (initLoader != nullptr) {
            // we found the entry point one way or another.
            LoaderLogger::LogInfoMessage(openxr_command,
                                         "RuntimeInterface::LoadRuntime forwarding xrInitializeLoaderKHR call to runtime before "
                                         "calling xrNegotiateLoaderRuntimeInterface.");
            XrResult res = initLoader(LoaderInitData::instance().getParam());
            if (!XR_SUCCEEDED(res)) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime forwarded call to xrInitializeLoaderKHR failed.");

                LoaderPlatformLibraryClose(runtime_library);
                return res;
            }
            forwardedInitLoader = true;
        }
    }
#endif

    // Get and settle on an runtime interface version (using any provided name if required).
    std::string function_name = manifest_file->GetFunctionName("xrNegotiateLoaderRuntimeInterface");
    auto negotiate =
        reinterpret_cast<PFN_xrNegotiateLoaderRuntimeInterface>(LoaderPlatformLibraryGetProcAddr(runtime_library, function_name));

    // Loader info for negotiation
    XrNegotiateLoaderInfo loader_info = {};
    loader_info.structType = XR_LOADER_INTERFACE_STRUCT_LOADER_INFO;
    loader_info.structVersion = XR_LOADER_INFO_STRUCT_VERSION;
    loader_info.structSize = sizeof(XrNegotiateLoaderInfo);
    loader_info.minInterfaceVersion = 1;
    loader_info.maxInterfaceVersion = XR_CURRENT_LOADER_RUNTIME_VERSION;
    loader_info.minApiVersion = XR_MAKE_VERSION(1, 0, 0);
    loader_info.maxApiVersion = XR_MAKE_VERSION(1, 0x3ff, 0xfff);  // Maximum allowed version for this major version.

    // Set up the runtime return structure
    XrNegotiateRuntimeRequest runtime_info = {};
    runtime_info.structType = XR_LOADER_INTERFACE_STRUCT_RUNTIME_REQUEST;
    runtime_info.structVersion = XR_RUNTIME_INFO_STRUCT_VERSION;
    runtime_info.structSize = sizeof(XrNegotiateRuntimeRequest);

    // Skip calling the negotiate function and fail if the function pointer
    // could not get loaded
    XrResult res = XR_ERROR_RUNTIME_FAILURE;
    if (nullptr != negotiate) {
        res = negotiate(&loader_info, &runtime_info);
    } else {
        std::string error_message = "RuntimeInterface::LoadRuntime failed to find negotiate function ";
        error_message += function_name;
        LoaderLogger::LogErrorMessage(openxr_command, error_message);
    }
    // If we supposedly succeeded, but got a nullptr for GetInstanceProcAddr
    // then something still went wrong, so return with an error.
    if (XR_SUCCEEDED(res)) {
        uint32_t runtime_major = XR_VERSION_MAJOR(runtime_info.runtimeApiVersion);
        uint32_t runtime_minor = XR_VERSION_MINOR(runtime_info.runtimeApiVersion);
        uint32_t loader_major = XR_VERSION_MAJOR(XR_CURRENT_API_VERSION);
        if (nullptr == runtime_info.getInstanceProcAddr) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", negotiation succeeded but returned NULL getInstanceProcAddr";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        } else if (0 >= runtime_info.runtimeInterfaceVersion ||
                   XR_CURRENT_LOADER_RUNTIME_VERSION < runtime_info.runtimeInterfaceVersion) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", negotiation succeeded but returned invalid interface version";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        } else if (runtime_major != loader_major || (runtime_major == 0 && runtime_minor == 0)) {
            std::string error_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
            error_message += manifest_file->Filename();
            error_message += ", OpenXR version returned not compatible with this loader";
            LoaderLogger::LogErrorMessage(openxr_command, error_message);
            res = XR_ERROR_FILE_CONTENTS_INVALID;
        }
    }
#ifdef XR_KHR_LOADER_INIT_SUPPORT
    if (XR_SUCCEEDED(res) && !forwardedInitLoader) {
        // Forward initialize loader call, where possible and if we did not do so before.
        PFN_xrVoidFunction initializeVoid = nullptr;
        PFN_xrInitializeLoaderKHR initialize = nullptr;

        // Now we may try asking xrGetInstanceProcAddr
        if (XR_SUCCEEDED(runtime_info.getInstanceProcAddr(XR_NULL_HANDLE, "xrInitializeLoaderKHR", &initializeVoid))) {
            if (initializeVoid == nullptr) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime got success from xrGetInstanceProcAddr "
                                              "for xrInitializeLoaderKHR, but output a null pointer.");
                res = XR_ERROR_RUNTIME_FAILURE;
            } else {
                initialize = reinterpret_cast<PFN_xrInitializeLoaderKHR>(initializeVoid);
            }
        }
        if (initialize != nullptr) {
            // we found the entry point one way or another.
            LoaderLogger::LogInfoMessage(openxr_command,
                                         "RuntimeInterface::LoadRuntime forwarding xrInitializeLoaderKHR call to runtime after "
                                         "calling xrNegotiateLoaderRuntimeInterface.");
            res = initialize(LoaderInitData::instance().getParam());
            if (!XR_SUCCEEDED(res)) {
                LoaderLogger::LogErrorMessage(openxr_command,
                                              "RuntimeInterface::LoadRuntime forwarded call to xrInitializeLoaderKHR failed.");
            }
        }
    }
#endif
    if (XR_FAILED(res)) {
        std::string warning_message = "RuntimeInterface::LoadRuntime skipping manifest file ";
        warning_message += manifest_file->Filename();
        warning_message += ", negotiation failed with error ";
        warning_message += std::to_string(res);
        LoaderLogger::LogErrorMessage(openxr_command, warning_message);
        LoaderPlatformLibraryClose(runtime_library);
        return res;
    }

    std::string info_message = "RuntimeInterface::LoadRuntime succeeded loading runtime defined in manifest file ";
    info_message += manifest_file->Filename();
    info_message += " using interface version ";
    info_message += std::to_string(runtime_info.runtimeInterfaceVersion);
    info_message += " and OpenXR API version ";
    info_message += std::to_string(XR_VERSION_MAJOR(runtime_info.runtimeApiVersion));
    info_message += ".";
    info_message += std::to_string(XR_VERSION_MINOR(runtime_info.runtimeApiVersion));
    LoaderLogger::LogInfoMessage(openxr_command, info_message);

    // Use this runtime
    GetInstance().reset(new RuntimeInterface(runtime_library, runtime_info.getInstanceProcAddr));

    // Grab the list of extensions this runtime supports for easy filtering after the
    // xrCreateInstance call
    std::vector<std::string> supported_extensions;
    std::vector<XrExtensionProperties> extension_properties;
    GetInstance()->GetInstanceExtensionProperties(extension_properties);
    supported_extensions.reserve(extension_properties.size());
    for (XrExtensionProperties ext_prop : extension_properties) {
        supported_extensions.emplace_back(ext_prop.extensionName);
    }
    GetInstance()->SetSupportedExtensions(supported_extensions);

    return XR_SUCCESS;
}